

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

pair<helics::ActionMessage_&,_bool> __thiscall
helics::FilterFederate::executeFilter(FilterFederate *this,ActionMessage *command,FilterInfo *filt)

{
  bool bVar1;
  element_type *peVar2;
  ActionMessage *pAVar3;
  GlobalBrokerId *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  ActionMessage *in_RSI;
  long in_RDI;
  pair<helics::ActionMessage_&,_bool> pVar5;
  ActionMessage cloneMessage;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> tempMessage;
  ActionMessage cmd;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *msg;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *__range3;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  new_messages;
  ActionMessage *in_stack_fffffffffffffbf8;
  ActionMessage *in_stack_fffffffffffffc00;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *in_stack_fffffffffffffc10;
  ActionMessage *in_stack_fffffffffffffc18;
  action_t startingAction;
  ActionMessage *in_stack_fffffffffffffc20;
  bool local_3a2;
  bool local_3a1;
  BaseType local_3a0;
  GlobalFederateId local_39c;
  BaseType local_398;
  GlobalFederateId local_394 [3];
  ActionMessage *in_stack_fffffffffffffc78;
  ActionMessage *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffd28;
  uint uVar6;
  undefined4 in_stack_fffffffffffffd2c;
  ActionMessage *in_stack_fffffffffffffd30;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  local_218 [8];
  undefined1 local_158 [8];
  undefined1 local_150 [8];
  undefined1 local_148 [200];
  reference local_80;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *local_78;
  __normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
  local_70;
  undefined1 *local_68;
  undefined1 local_50 [8];
  undefined1 local_48 [28];
  BaseType local_2c;
  GlobalBrokerId *local_28;
  ActionMessage *local_20;
  pair<helics::ActionMessage_&,_bool> local_10;
  
  *(undefined1 *)(in_RDI + 0x285) = 1;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_2c = (BaseType)
             GlobalFederateId::operator_cast_to_GlobalBrokerId
                       ((GlobalFederateId *)in_stack_fffffffffffffbf8);
  bVar1 = GlobalBrokerId::operator==(in_RDX,(GlobalBrokerId)local_2c);
  if (bVar1) {
    if ((local_28[0x26].gid & 0x100) == 0) {
      startingAction = (action_t)((ulong)local_148 >> 0x20);
      createMessageFromCommand(in_stack_fffffffffffffc78);
      pAVar3 = (ActionMessage *)
               std::
               __shared_ptr_access<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x6546d4);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffffc00,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffffbf8);
      (*(*(_func_int ***)pAVar3)[2])(local_150,pAVar3,local_158);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator=
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffffc00,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffffbf8);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffffc10);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffffc10);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                         0x654749);
      if (bVar1) {
        in_stack_fffffffffffffc10 = local_218;
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_fffffffffffffc00,
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_fffffffffffffbf8);
        ActionMessage::ActionMessage
                  (in_stack_fffffffffffffd30,
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        ActionMessage::operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        ActionMessage::~ActionMessage(in_stack_fffffffffffffc00);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_fffffffffffffc10);
      }
      else {
        ActionMessage::ActionMessage(pAVar3,startingAction);
        ActionMessage::operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        ActionMessage::~ActionMessage(in_stack_fffffffffffffc00);
        std::pair<helics::ActionMessage_&,_bool>::pair<bool,_true>
                  (&local_10,local_20,(bool *)&stack0xfffffffffffffd2f);
      }
      uVar6 = (uint)!bVar1;
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffffc10);
      uVar4 = extraout_RDX;
      if (uVar6 != 0) goto LAB_00654a16;
    }
    else {
      peVar2 = std::
               __shared_ptr_access<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x6544cf);
      createMessageFromCommand(in_stack_fffffffffffffc88);
      (*peVar2->_vptr_FilterOperator[3])(local_48,peVar2,local_50);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffffc10);
      local_68 = local_48;
      local_70._M_current =
           (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
           std::
           vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           ::begin((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                    *)in_stack_fffffffffffffbf8);
      local_78 = (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 std::
                 vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                 ::end((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                        *)in_stack_fffffffffffffbf8);
      while (bVar1 = __gnu_cxx::
                     operator==<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                               ((__normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                                 *)in_stack_fffffffffffffc00,
                                (__normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                                 *)in_stack_fffffffffffffbf8), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_80 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                   ::operator*(&local_70);
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           0x654594);
        if (bVar1) {
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_fffffffffffffc00,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_fffffffffffffbf8);
          ActionMessage::ActionMessage
                    (in_stack_fffffffffffffd30,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_fffffffffffffc10);
          std::function<void_(helics::ActionMessage_&)>::operator()
                    ((function<void_(helics::ActionMessage_&)> *)in_stack_fffffffffffffc00,
                     in_stack_fffffffffffffbf8);
          ActionMessage::~ActionMessage(in_stack_fffffffffffffc00);
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
        ::operator++(&local_70);
      }
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::~vector(in_stack_fffffffffffffc10);
    }
  }
  else {
    if ((local_28[0x26].gid & 0x100) == 0) {
      local_3a0 = local_28->gid;
      GlobalFederateId::GlobalFederateId(&local_39c,(GlobalBrokerId)local_3a0);
      (local_20->dest_id).gid = local_39c.gid;
      (local_20->dest_handle).hid = local_28[1].gid;
      local_3a1 = false;
      std::pair<helics::ActionMessage_&,_bool>::pair<bool,_true>(&local_10,local_20,&local_3a1);
      uVar4 = extraout_RDX_00;
      goto LAB_00654a16;
    }
    pAVar3 = (ActionMessage *)(local_394 + 1);
    ActionMessage::ActionMessage(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    ActionMessage::setAction(pAVar3,cmd_send_for_filter);
    setActionFlag<helics::ActionMessage,helics::FilterFlags>
              ((ActionMessage *)(local_394 + 1),clone_flag);
    local_398 = local_28->gid;
    GlobalFederateId::GlobalFederateId(local_394,(GlobalBrokerId)local_398);
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              ((function<void_(const_helics::ActionMessage_&)> *)pAVar3,in_stack_fffffffffffffbf8);
    ActionMessage::~ActionMessage(pAVar3);
  }
  local_3a2 = true;
  std::pair<helics::ActionMessage_&,_bool>::pair<bool,_true>(&local_10,local_20,&local_3a2);
  uVar4 = extraout_RDX_01;
LAB_00654a16:
  pVar5._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  pVar5.second = local_10.second;
  pVar5.first = local_10.first;
  return pVar5;
}

Assistant:

std::pair<ActionMessage&, bool> FilterFederate::executeFilter(ActionMessage& command,
                                                              FilterInfo* filt)
{
    mCoord.triggered = true;
    if (filt->core_id == mFedID) {
        if (filt->cloning) {
            // cloning filter returns a vector
            auto new_messages = filt->filterOp->processVector(createMessageFromCommand(command));
            for (auto& msg : new_messages) {
                if (msg) {
                    ActionMessage cmd(std::move(msg));
                    mDeliverMessage(cmd);
                }
            }
        } else {
            // deal with local source filters
            auto tempMessage = createMessageFromCommand(std::move(command));
            tempMessage = filt->filterOp->process(std::move(tempMessage));
            if (tempMessage) {
                command = ActionMessage(std::move(tempMessage));
            } else {
                // the filter dropped the message;
                command = CMD_IGNORE;
                return {command, false};
            }
        }
    } else if (filt->cloning) {
        ActionMessage cloneMessage(command);
        cloneMessage.setAction(CMD_SEND_FOR_FILTER);
        setActionFlag(cloneMessage, clone_flag);
        cloneMessage.dest_id = filt->core_id;
        cloneMessage.dest_handle = filt->handle;
        mSendMessage(cloneMessage);
    } else {
        command.dest_id = filt->core_id;
        command.dest_handle = filt->handle;

        return {command, false};
    }
    return {command, true};
}